

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderstyle.cpp
# Opt level: O0

bool __thiscall FRenderStyle::IsVisible(FRenderStyle *this,double alpha)

{
  double dVar1;
  bool local_41;
  double local_20;
  double alpha_local;
  FRenderStyle *this_local;
  
  if (*this == (FRenderStyle)0x0) {
    this_local._7_1_ = false;
  }
  else if ((*this == (FRenderStyle)0x1) || (*this == (FRenderStyle)0x3)) {
    if (((byte)this[3] & 2) == 0) {
      local_20 = clamp<double>(alpha,0.0,1.0);
    }
    else {
      local_20 = 1.0;
    }
    dVar1 = GetAlpha((uint)(byte)this[1],local_20);
    local_41 = true;
    if ((dVar1 == 0.0) && (!NAN(dVar1))) {
      dVar1 = GetAlpha((uint)(byte)this[2],local_20);
      local_41 = dVar1 != 1.0;
    }
    this_local._7_1_ = local_41;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool FRenderStyle::IsVisible(double alpha) const throw()
{
	if (BlendOp == STYLEOP_None)
	{
		return false;
	}
	if (BlendOp == STYLEOP_Add || BlendOp == STYLEOP_RevSub)
	{
		if (Flags & STYLEF_Alpha1)
		{
			alpha = 1.;
		}
		else
		{
			alpha = clamp(alpha, 0., 1.);
		}
		return GetAlpha(SrcAlpha, alpha) != 0 || GetAlpha(DestAlpha, alpha) != 1;
	}
	// Treat anything else as visible.
	return true;
}